

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_objref.cpp
# Opt level: O1

bool __thiscall ON_COMPONENT_INDEX::IsSet(ON_COMPONENT_INDEX *this)

{
  TYPE TVar1;
  
  TVar1 = this->m_type;
  if ((0x33 < (ulong)TVar1) || ((0x802008020f83eU >> ((ulong)TVar1 & 0x3f) & 1) == 0)) {
    if (0x23 < TVar1 - subd_vertex) {
      return false;
    }
    if ((0xfe0000407U >> ((ulong)(TVar1 - subd_vertex) & 0x3f) & 1) == 0) {
      return false;
    }
  }
  return this->m_index != -1;
}

Assistant:

bool ON_COMPONENT_INDEX::IsSet() const
{
  bool rc = false;
  switch(m_type)
  {
  case ON_COMPONENT_INDEX::invalid_type:
    rc = false;
    break;

  case ON_COMPONENT_INDEX::no_type:
    rc = false;
    break;

  case ON_COMPONENT_INDEX::brep_vertex:
  case ON_COMPONENT_INDEX::brep_edge:
  case ON_COMPONENT_INDEX::brep_face:
  case ON_COMPONENT_INDEX::brep_trim:
  case ON_COMPONENT_INDEX::brep_loop:

  case ON_COMPONENT_INDEX::mesh_vertex:
  case ON_COMPONENT_INDEX::meshtop_vertex:
  case ON_COMPONENT_INDEX::meshtop_edge:
  case ON_COMPONENT_INDEX::mesh_face:
  case ON_COMPONENT_INDEX::mesh_ngon:

  case ON_COMPONENT_INDEX::idef_part:
  case ON_COMPONENT_INDEX::polycurve_segment:
  case ON_COMPONENT_INDEX::pointcloud_point:
  case ON_COMPONENT_INDEX::group_member:

  case ON_COMPONENT_INDEX::subd_vertex:
  case ON_COMPONENT_INDEX::subd_edge:
  case ON_COMPONENT_INDEX::subd_face:

  case ON_COMPONENT_INDEX::hatch_loop:

  case ON_COMPONENT_INDEX::dim_linear_point:
  case ON_COMPONENT_INDEX::dim_radial_point:
  case ON_COMPONENT_INDEX::dim_angular_point:
  case ON_COMPONENT_INDEX::dim_ordinate_point:
  case ON_COMPONENT_INDEX::dim_text_point:
  case ON_COMPONENT_INDEX::dim_centermark_point:
  case ON_COMPONENT_INDEX::dim_leader_point:

    rc = (m_index != -1);
    break;

  default:
    rc = false;
    break;
  }
  return rc;
}